

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
          (PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this,Index size)

{
  Index size_local;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_local;
  
  if (-1 < size) {
    DenseStorage<int,_-1,_-1,_1,_0>::resize(&this->m_storage,size,size,1);
    return;
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/PlainObjectBase.h"
                ,0x10c,
                "void Eigen::PlainObjectBase<Eigen::Matrix<int, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<int, -1, 1>]"
               );
}

Assistant:

inline void resize(Index size)
    {
      EIGEN_STATIC_ASSERT_VECTOR_ONLY(PlainObjectBase)
      eigen_assert(((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0);
      #ifdef EIGEN_INITIALIZE_COEFFS
        bool size_changed = size != this->size();
      #endif
      if(RowsAtCompileTime == 1)
        m_storage.resize(size, 1, size);
      else
        m_storage.resize(size, size, 1);
      #ifdef EIGEN_INITIALIZE_COEFFS
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #endif
    }